

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitVolumeSample.cpp
# Opt level: O0

void splitVolumeSample(float a,float c,float zf,float zb,float z,float *af,float *cf,float *ab,
                      float *cb)

{
  float fVar1;
  float *pfVar2;
  float *in_RCX;
  float *in_RDX;
  float *in_RSI;
  float *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float xb;
  float xf;
  float local_40;
  float local_3c;
  float *local_38;
  float *local_30;
  float *local_28;
  float *local_20;
  float local_14;
  float local_10;
  float local_c;
  float local_8;
  float local_4;
  
  local_3c = 0.0;
  local_40 = 1.0;
  local_38 = in_RCX;
  local_30 = in_RDX;
  local_28 = in_RSI;
  local_20 = in_RDI;
  local_14 = in_XMM4_Da;
  local_10 = in_XMM3_Da;
  local_c = in_XMM2_Da;
  local_8 = in_XMM1_Da;
  pfVar2 = std::min<float>(&local_4,&local_40);
  pfVar2 = std::max<float>(&local_3c,pfVar2);
  fVar1 = *pfVar2;
  if ((fVar1 != 1.0) || (NAN(fVar1))) {
    fVar3 = (local_14 - local_c) / (local_10 - local_c);
    fVar4 = (local_10 - local_14) / (local_10 - local_c);
    local_4 = fVar1;
    fVar5 = std::numeric_limits<float>::min();
    if (fVar1 <= fVar5) {
      *local_20 = local_4 * fVar3;
      *local_28 = local_8 * fVar3;
      *local_30 = local_4 * fVar4;
      *local_38 = local_8 * fVar4;
    }
    else {
      dVar6 = std::log1p((double)(ulong)(uint)-local_4);
      dVar6 = std::expm1((double)(ulong)(uint)(fVar3 * SUB84(dVar6,0)));
      *local_20 = -SUB84(dVar6,0);
      *local_28 = (*local_20 / local_4) * local_8;
      dVar6 = std::log1p((double)(ulong)(uint)-local_4);
      dVar6 = std::expm1((double)(ulong)(uint)(fVar4 * SUB84(dVar6,0)));
      *local_30 = -SUB84(dVar6,0);
      *local_38 = (*local_30 / local_4) * local_8;
    }
  }
  else {
    *local_30 = 1.0;
    *local_20 = 1.0;
    *local_38 = local_8;
    *local_28 = local_8;
  }
  return;
}

Assistant:

void
splitVolumeSample (
    float  a,
    float  c, // Opacity and color of original sample
    float  zf,
    float  zb, // Front and back of original sample
    float  z,  // Position of split
    float& af,
    float& cf, // Opacity and color of part closer than z
    float& ab,
    float& cb) // Opacity and color of part further away than z
{
    //
    // Given a volume sample whose front and back are at depths zf and
    // zb respectively, split the sample at depth z. Return the opacities
    // and colors of the two parts that result from the split.
    //
    // The code below is written to avoid excessive rounding errors when
    // the opacity of the original sample is very small:
    //
    // The straightforward computation of the opacity of either part
    // requires evaluating an expression of the form
    //
    // 1 - pow (1-a, x).
    //
    // However, if a is very small, then 1-a evaluates to 1.0 exactly,
    // and the entire expression evaluates to 0.0.
    //
    // We can avoid this by rewriting the expression as
    //
    // 1 - exp (x \* log (1-a)),
    //
    // and replacing the call to log() with a call to the function log1p(),
    // which computes the logarithm of 1+x without attempting to evaluate
    // the expression 1+x when x is very small.
    //
    // Now we have
    //
    // 1 - exp (x \* log1p (-a)).
    //
    // However, if a is very small then the call to exp() returns 1.0, and
    // the overall expression still evaluates to 0.0. We can avoid that
    // by replacing the call to exp() with a call to expm1():
    //
    // -expm1 (x \* log1p (-a))
    //
    // expm1(x) computes exp(x) - 1 in such a way that the result is
    // even if x is very small.
    //

    assert (zb > zf && z >= zf && z <= zb);

    a = max (0.0f, min (a, 1.0f));

    if (a == 1)
    {
        af = ab = 1;
        cf = cb = c;
    }
    else
    {
        float xf = (z - zf) / (zb - zf);
        float xb = (zb - z) / (zb - zf);

        if (a > numeric_limits<float>::min ())
        {
            af = -expm1 (xf * log1p (-a));
            cf = (af / a) * c;

            ab = -expm1 (xb * log1p (-a));
            cb = (ab / a) * c;
        }
        else
        {
            af = a * xf;
            cf = c * xf;

            ab = a * xb;
            cb = c * xb;
        }
    }
}